

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O0

vector3df __thiscall irr::scene::SViewFrustum::getNearRightDown(SViewFrustum *this)

{
  vector3df vVar1;
  plane3d<float> *in_RDI;
  vector3df p;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  float in_stack_fffffffffffffff4;
  float in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  
  core::vector3d<float>::vector3d((vector3d<float> *)&stack0xfffffffffffffff4);
  core::plane3d<float>::getIntersectionWithPlanes
            ((plane3d<float> *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (plane3d<float> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_RDI,
             (vector3d<float> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  vVar1.Y = in_stack_fffffffffffffff8;
  vVar1.X = in_stack_fffffffffffffff4;
  vVar1.Z = in_stack_fffffffffffffffc;
  return vVar1;
}

Assistant:

inline core::vector3df SViewFrustum::getNearRightDown() const
{
	core::vector3df p;
	planes[scene::SViewFrustum::VF_NEAR_PLANE].getIntersectionWithPlanes(
			planes[scene::SViewFrustum::VF_BOTTOM_PLANE],
			planes[scene::SViewFrustum::VF_RIGHT_PLANE], p);

	return p;
}